

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

int collectSafetyInvariantPOIndex(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  long lVar3;
  
  pVVar1 = pNtk->vPos;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar1->pArray[lVar3]);
      pcVar2 = strstr(pcVar2,"csSafetyInvar_");
      if (pcVar2 != (char *)0x0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vPos;
    } while (lVar3 < pVVar1->nSize);
  }
  return -1;
}

Assistant:

int collectSafetyInvariantPOIndex(Abc_Ntk_t *pNtk)
{
	Abc_Obj_t *pObj;
	int i;

	Abc_NtkForEachPo( pNtk, pObj, i )
	{
		if( strstr( Abc_ObjName( pObj ), "csSafetyInvar_" ) != NULL )
			return i;
	}		

	return -1;
}